

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleErrorsTest::iterate
          (StorageMultisampleErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar8;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar7);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    (**(code **)(lVar8 + 0xfb0))(this->m_rbo_invalid,1,0x8058,1,1);
    bVar1 = ExpectError(this,0x502,"NamedRenderbufferStorageMultisample",
                        "renderbuffer is not the name of an existing renderbuffer object.");
    (**(code **)(lVar8 + 0xfb0))(this->m_rbo_valid,this->m_max_samples + 1,0x8058,1,1);
    bVar2 = ExpectError(this,0x502,"NamedRenderbufferStorageMultisample",
                        "samples is greater than MAX_SAMPLES.");
    (**(code **)(lVar8 + 0xfb0))(this->m_rbo_valid,1,0x8058,0xffffffff,1);
    bVar3 = ExpectError(this,0x501,"NamedRenderbufferStorageMultisample",
                        "either of width is negative.");
    (**(code **)(lVar8 + 0xfb0))(this->m_rbo_valid,1,0x8058,1,0xffffffff);
    bVar4 = ExpectError(this,0x501,"NamedRenderbufferStorageMultisample",
                        "either of height is negative.");
    (**(code **)(lVar8 + 0xfb0))(this->m_rbo_valid,this->m_max_samples + 1,0x906f,1,1);
    bVar5 = ExpectError(this,0x502,"NamedRenderbufferStorageMultisample",
                        "internalformat is a signed or unsigned integer format and samples is greater than the value of MAX_INTEGER_SAMPLES."
                       );
    (**(code **)(lVar8 + 0xfb0))(this->m_rbo_valid,1,this->m_internalformat_invalid,1,1);
    bVar6 = ExpectError(this,0x500,"NamedRenderbufferStorageMultisample",
                        "internalformat is not a color-renderable, depth-renderable, or stencil-renderable format (it is COMPRESSED_RED)."
                       );
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageMultisampleErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		/*  Check that INVALID_OPERATION is generated by NamedRenderbufferStorage if
		 renderbuffer is not the name of an existing renderbuffer object. */
		gl.namedRenderbufferStorageMultisample(m_rbo_invalid, 1, GL_RGBA8, 1, 1);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedRenderbufferStorageMultisample",
							 "renderbuffer is not the name of an existing renderbuffer object.");

		/*  Check that INVALID_VALUE is generated by
		 NamedRenderbufferStorageMultisample if samples is greater than
		 MAX_SAMPLES. */
		gl.namedRenderbufferStorageMultisample(m_rbo_valid, m_max_samples + 1, GL_RGBA8, 1, 1);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedRenderbufferStorageMultisample",
							 "samples is greater than MAX_SAMPLES.");

		/*  Check that INVALID_VALUE is generated by NamedRenderbufferStorage if
		 either of width or height is negative, or greater than the value of
		 MAX_RENDERBUFFER_SIZE. */
		gl.namedRenderbufferStorageMultisample(m_rbo_valid, 1, GL_RGBA8, -1, 1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedRenderbufferStorageMultisample", "either of width is negative.");

		gl.namedRenderbufferStorageMultisample(m_rbo_valid, 1, GL_RGBA8, 1, -1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedRenderbufferStorageMultisample", "either of height is negative.");

		/*  Check that INVALID_OPERATION is generated by
		 NamedRenderbufferStorageMultisample if internalformat is a signed or
		 unsigned integer format and samples is greater than the value of
		 MAX_INTEGER_SAMPLES. */
		gl.namedRenderbufferStorageMultisample(m_rbo_valid, m_max_samples + 1, GL_RGB10_A2UI, 1, 1);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedRenderbufferStorageMultisample",
							 "internalformat is a signed or unsigned integer format and samples is greater than the "
							 "value of MAX_INTEGER_SAMPLES.");

		/*  Check that INVALID_ENUM is generated by NamedRenderbufferStorage if
		 internalformat is not a color-renderable, depth-renderable, or
		 stencil-renderable format. */
		gl.namedRenderbufferStorageMultisample(m_rbo_valid, 1, m_internalformat_invalid, 1, 1);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedRenderbufferStorageMultisample",
							 "internalformat is not a color-renderable, depth-renderable, or stencil-renderable format "
							 "(it is COMPRESSED_RED).");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}